

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase
          (ArrayJoinPromiseNodeBase *this,Array<kj::Own<kj::_::PromiseNode>_> *promises,
          ExceptionOrValue *resultParts,size_t partSize)

{
  ulong uVar1;
  Branch *pBVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *pRVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_t sVar8;
  ulong uVar9;
  Branch *pBVar10;
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> builder;
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> local_78;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *local_50;
  Branch *local_48;
  size_t local_40;
  ArrayDisposer *local_38;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006289c8;
  this->countLeft = (uint)promises->size_;
  local_50 = &this->branches;
  (this->onReadyEvent).event = (Event *)0x0;
  (this->branches).ptr = (Branch *)0x0;
  (this->branches).size_ = 0;
  (this->branches).disposer = (ArrayDisposer *)0x0;
  sVar8 = promises->size_;
  local_78.ptr = (Branch *)
                 HeapArrayDisposer::allocateImpl
                           (0x48,0,sVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_78.endPtr = local_78.ptr + sVar8;
  local_78.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  uVar1 = promises->size_;
  pBVar7 = local_78.ptr;
  pBVar10 = local_78.ptr;
  if (uVar1 != 0) {
    uVar9 = 0;
    local_78.pos = local_78.ptr;
    do {
      ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::
      add<kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
                (&local_78,this,promises->ptr + (uVar9 & 0xffffffff),
                 (ExceptionOrValue *)
                 (&(resultParts->exception).ptr.isSet + (uVar9 & 0xffffffff) * partSize));
      uVar9 = uVar9 + 1;
      pBVar7 = local_78.ptr;
      pBVar10 = local_78.pos;
    } while (uVar1 != uVar9);
  }
  pAVar6 = local_78.disposer;
  sVar8 = ((long)pBVar10 - (long)pBVar7 >> 3) * -0x71c71c71c71c71c7;
  local_78.ptr = (Branch *)0x0;
  local_78.pos = (RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *)0x0;
  local_78.endPtr = (Branch *)0x0;
  pBVar2 = local_50->ptr;
  local_48 = pBVar7;
  local_40 = sVar8;
  local_38 = local_78.disposer;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (this->branches).size_;
    local_50->ptr = (Branch *)0x0;
    local_50->size_ = 0;
    pAVar4 = (this->branches).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pBVar2,0x48,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::_::ArrayJoinPromiseNodeBase::Branch,_false>::destruct);
  }
  (this->branches).ptr = pBVar7;
  (this->branches).size_ = sVar8;
  (this->branches).disposer = pAVar6;
  if (pBVar10 == pBVar7) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  pBVar10 = local_78.endPtr;
  pRVar5 = local_78.pos;
  pBVar7 = local_78.ptr;
  if (local_78.ptr != (Branch *)0x0) {
    local_78.ptr = (Branch *)0x0;
    local_78.pos = (RemoveConst<kj::_::ArrayJoinPromiseNodeBase::Branch> *)0x0;
    local_78.endPtr = (Branch *)0x0;
    (**(local_78.disposer)->_vptr_ArrayDisposer)
              (local_78.disposer,pBVar7,0x48,
               ((long)pRVar5 - (long)pBVar7 >> 3) * -0x71c71c71c71c71c7,
               ((long)pBVar10 - (long)pBVar7 >> 3) * -0x71c71c71c71c71c7,
               ArrayDisposer::Dispose_<kj::_::ArrayJoinPromiseNodeBase::Branch,_false>::destruct);
  }
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase(
    Array<Own<PromiseNode>> promises, ExceptionOrValue* resultParts, size_t partSize)
    : countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i: indices(promises)) {
    ExceptionOrValue& output = *reinterpret_cast<ExceptionOrValue*>(
        reinterpret_cast<byte*>(resultParts) + i * partSize);
    builder.add(*this, kj::mv(promises[i]), output);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}